

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

int fmt::v6::internal::
    parse_nonnegative_int<char,fmt::v6::internal::precision_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>>&,char>&>
              (char **begin,char *end,
              precision_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>_&,_char>
              *eh)

{
  char *pcVar1;
  char cVar2;
  uint uVar3;
  
  cVar2 = **begin;
  pcVar1 = *begin + 1;
  if (cVar2 == '0') {
    *begin = pcVar1;
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    do {
      if (0xccccccc < uVar3) {
        uVar3 = 0x80000000;
        goto LAB_0012fb9d;
      }
      uVar3 = (uVar3 * 10 + (int)cVar2) - 0x30;
      *begin = pcVar1;
      if (pcVar1 == end) break;
      cVar2 = *pcVar1;
      pcVar1 = pcVar1 + 1;
    } while ((byte)(cVar2 - 0x30U) < 10);
    if ((int)uVar3 < 0) {
LAB_0012fb9d:
      precision_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>_&,_char>
      ::on_error(eh,"number is too big");
    }
  }
  return uVar3;
}

Assistant:

FMT_CONSTEXPR int parse_nonnegative_int(const Char*& begin, const Char* end,
                                        ErrorHandler&& eh) {
  FMT_ASSERT(begin != end && '0' <= *begin && *begin <= '9', "");
  if (*begin == '0') {
    ++begin;
    return 0;
  }
  unsigned value = 0;
  // Convert to unsigned to prevent a warning.
  constexpr unsigned max_int = max_value<int>();
  unsigned big = max_int / 10;
  do {
    // Check for overflow.
    if (value > big) {
      value = max_int + 1;
      break;
    }
    value = value * 10 + unsigned(*begin - '0');
    ++begin;
  } while (begin != end && '0' <= *begin && *begin <= '9');
  if (value > max_int) eh.on_error("number is too big");
  return static_cast<int>(value);
}